

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

BCReg const_gc(FuncState *fs,GCobj *gc,uint32_t itype)

{
  BCReg BVar1;
  TValue *pTVar2;
  TValue TVar3;
  TValue key;
  cTValue local_10;
  
  local_10.u32.lo = (uint32_t)gc;
  local_10.field_2.it = itype;
  pTVar2 = lj_tab_set(fs->L,fs->kt,&local_10);
  if ((pTVar2->field_2).it == 0) {
    BVar1 = (pTVar2->u32).lo;
  }
  else {
    TVar3.field_2.it = 0;
    TVar3.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)fs->nkgc;
    *pTVar2 = TVar3;
    BVar1 = fs->nkgc;
    fs->nkgc = BVar1 + 1;
  }
  return BVar1;
}

Assistant:

static BCReg const_gc(FuncState *fs, GCobj *gc, uint32_t itype)
{
  lua_State *L = fs->L;
  TValue key, *o;
  setgcV(L, &key, gc, itype);
  /* NOBARRIER: the key is new or kept alive. */
  o = lj_tab_set(L, fs->kt, &key);
  if (tvhaskslot(o))
    return tvkslot(o);
  o->u64 = fs->nkgc;
  return fs->nkgc++;
}